

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCmpiRg<(moira::Instr)39,(moira::Mode)0,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  u32 uVar3;
  StrWriter *pSVar4;
  
  uVar3 = dasmRead<(moira::Size)1>(this,addr);
  pSVar4 = StrWriter::operator<<(str);
  pSVar4 = StrWriter::operator<<(pSVar4);
  StrWriter::operator<<(pSVar4,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar4,(Ims)(int)(char)uVar3);
  StrWriter::operator<<(pSVar4,", ");
  pcVar1 = pSVar4->ptr;
  pSVar4->ptr = pcVar1 + 1;
  *pcVar1 = 'D';
  pbVar2 = (byte *)pSVar4->ptr;
  pSVar4->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmCmpiRg(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Dn  ( _____________xxx(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}